

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

void __thiscall llvm::detail::DoubleAPFloat::DoubleAPFloat(DoubleAPFloat *this,DoubleAPFloat *RHS)

{
  APFloat *pAVar1;
  undefined8 *puVar2;
  fltSemantics *pfVar3;
  APFloat *pAVar4;
  
  pfVar3 = RHS->Semantics;
  this->Semantics = pfVar3;
  pAVar1 = (RHS->Floats)._M_t.
           super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
           super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
           super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
  if (pAVar1 == (APFloat *)0x0) {
    pAVar4 = (APFloat *)0x0;
  }
  else {
    puVar2 = (undefined8 *)operator_new__(0x48);
    *puVar2 = 2;
    pAVar4 = (APFloat *)(puVar2 + 1);
    APFloat::Storage::Storage((Storage *)(puVar2 + 2),&pAVar1->U);
    APFloat::Storage::Storage
              ((Storage *)(puVar2 + 6),
               &(RHS->Floats)._M_t.
                super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl[1].U);
    pfVar3 = this->Semantics;
  }
  (this->Floats)._M_t.super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
  _M_t.super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
  super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl = pAVar4;
  if (pfVar3 == (fltSemantics *)semPPCDoubleDouble) {
    return;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0xf32,"llvm::detail::DoubleAPFloat::DoubleAPFloat(const DoubleAPFloat &)");
}

Assistant:

DoubleAPFloat::DoubleAPFloat(const DoubleAPFloat &RHS)
    : Semantics(RHS.Semantics),
      Floats(RHS.Floats ? new APFloat[2]{APFloat(RHS.Floats[0]),
                                         APFloat(RHS.Floats[1])}
                        : nullptr) {
  assert(Semantics == &semPPCDoubleDouble);
}